

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_barriers.cpp
# Opt level: O1

spv_result_t spvtools::val::BarriersPass(ValidationState_t *_,Instruction *inst)

{
  size_t *psVar1;
  ushort uVar2;
  pointer puVar3;
  spv_result_t sVar4;
  uint32_t uVar5;
  Op OVar6;
  spv_result_t id;
  spv_result_t sVar7;
  Function *pFVar8;
  _Node *p_Var9;
  DiagnosticStream *pDVar10;
  uint32_t operand_index;
  bool bVar11;
  char *local_230;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  DiagnosticStream local_208;
  
  uVar2 = (inst->inst_).opcode;
  if (uVar2 < 0x148) {
    if (uVar2 == 0xe0) {
      if (_->version_ < 0x10300) {
        pFVar8 = ValidationState_t::function(_,inst->function_->id_);
        local_228._M_unused._M_object = (void *)0x0;
        local_228._8_8_ = 0;
        local_210 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_barriers.cpp:40:17)>
                    ::_M_invoke;
        local_218 = std::
                    _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_barriers.cpp:40:17)>
                    ::_M_manager;
        p_Var9 = std::__cxx11::
                 list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                 ::
                 _M_create_node<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>const&>
                           ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
                             *)&pFVar8->execution_model_limitations_,
                            (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                             *)&local_228);
        std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
        psVar1 = &(pFVar8->execution_model_limitations_).
                  super__List_base<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_218 != (code *)0x0) {
          (*local_218)(&local_228,&local_228,__destroy_functor);
        }
      }
      puVar3 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = puVar3[2];
      sVar4 = ValidateExecutionScope(_,inst,puVar3[1]);
      if (sVar4 == SPV_SUCCESS) {
        sVar7 = ValidateMemoryScope(_,inst,uVar5);
        id = sVar4;
        sVar4 = sVar7;
joined_r0x00600ee0:
        if (sVar4 == SPV_SUCCESS) {
          operand_index = 2;
          goto LAB_00600fab;
        }
      }
    }
    else {
      if (uVar2 != 0xe1) {
        return SPV_SUCCESS;
      }
      uVar5 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[1];
      sVar4 = ValidateMemoryScope(_,inst,uVar5);
      if (sVar4 == SPV_SUCCESS) {
        operand_index = 1;
        id = sVar4;
LAB_00600fab:
        sVar4 = ValidateMemorySemantics(_,inst,operand_index,uVar5);
        bVar11 = sVar4 == SPV_SUCCESS;
        if (!bVar11) {
          id = sVar4;
        }
        goto joined_r0x0060113b;
      }
    }
  }
  else {
    if (uVar2 == 0x148) {
      OVar6 = ValidationState_t::GetIdOpcode(_,(inst->inst_).type_id);
      if (OVar6 != OpTypeNamedBarrier) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        local_230 = spvOpcodeString(OpNamedBarrierInitialize);
        pDVar10 = DiagnosticStream::operator<<(&local_208,&local_230);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar10,": expected Result Type to be OpTypeNamedBarrier",0x2f);
        sVar4 = pDVar10->error_;
        DiagnosticStream::~DiagnosticStream(&local_208);
        return sVar4;
      }
      id = ValidationState_t::GetOperandTypeId(_,inst,2);
      bVar11 = ValidationState_t::IsIntScalarType(_,id);
      if ((bVar11) && (uVar5 = ValidationState_t::GetBitWidth(_,id), uVar5 == 0x20)) {
        bVar11 = true;
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        local_230 = spvOpcodeString(OpNamedBarrierInitialize);
        pDVar10 = DiagnosticStream::operator<<(&local_208,&local_230);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar10,": expected Subgroup Count to be a 32-bit int",0x2c);
        id = pDVar10->error_;
        DiagnosticStream::~DiagnosticStream(&local_208);
        bVar11 = false;
      }
      goto joined_r0x0060113b;
    }
    if (uVar2 != 0x149) {
      return SPV_SUCCESS;
    }
    uVar5 = ValidationState_t::GetOperandTypeId(_,inst,0);
    OVar6 = ValidationState_t::GetIdOpcode(_,uVar5);
    if (OVar6 == OpTypeNamedBarrier) {
      uVar5 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[2];
      id = ValidateMemoryScope(_,inst,uVar5);
      sVar4 = id;
      goto joined_r0x00600ee0;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    local_230 = spvOpcodeString(OpMemoryNamedBarrier);
    pDVar10 = DiagnosticStream::operator<<(&local_208,&local_230);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar10,": expected Named Barrier to be of type OpTypeNamedBarrier",0x39);
    sVar4 = pDVar10->error_;
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  bVar11 = false;
  id = sVar4;
joined_r0x0060113b:
  if (bVar11) {
    return SPV_SUCCESS;
  }
  return id;
}

Assistant:

spv_result_t BarriersPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  const uint32_t result_type = inst->type_id();

  switch (opcode) {
    case spv::Op::OpControlBarrier: {
      if (_.version() < SPV_SPIRV_VERSION_WORD(1, 3)) {
        _.function(inst->function()->id())
            ->RegisterExecutionModelLimitation(
                [](spv::ExecutionModel model, std::string* message) {
                  if (model != spv::ExecutionModel::TessellationControl &&
                      model != spv::ExecutionModel::GLCompute &&
                      model != spv::ExecutionModel::Kernel &&
                      model != spv::ExecutionModel::TaskNV &&
                      model != spv::ExecutionModel::MeshNV) {
                    if (message) {
                      *message =
                          "OpControlBarrier requires one of the following "
                          "Execution "
                          "Models: TessellationControl, GLCompute, Kernel, "
                          "MeshNV or TaskNV";
                    }
                    return false;
                  }
                  return true;
                });
      }

      const uint32_t execution_scope = inst->word(1);
      const uint32_t memory_scope = inst->word(2);

      if (auto error = ValidateExecutionScope(_, inst, execution_scope)) {
        return error;
      }

      if (auto error = ValidateMemoryScope(_, inst, memory_scope)) {
        return error;
      }

      if (auto error = ValidateMemorySemantics(_, inst, 2, memory_scope)) {
        return error;
      }
      break;
    }

    case spv::Op::OpMemoryBarrier: {
      const uint32_t memory_scope = inst->word(1);

      if (auto error = ValidateMemoryScope(_, inst, memory_scope)) {
        return error;
      }

      if (auto error = ValidateMemorySemantics(_, inst, 1, memory_scope)) {
        return error;
      }
      break;
    }

    case spv::Op::OpNamedBarrierInitialize: {
      if (_.GetIdOpcode(result_type) != spv::Op::OpTypeNamedBarrier) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Result Type to be OpTypeNamedBarrier";
      }

      const uint32_t subgroup_count_type = _.GetOperandTypeId(inst, 2);
      if (!_.IsIntScalarType(subgroup_count_type) ||
          _.GetBitWidth(subgroup_count_type) != 32) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Subgroup Count to be a 32-bit int";
      }
      break;
    }

    case spv::Op::OpMemoryNamedBarrier: {
      const uint32_t named_barrier_type = _.GetOperandTypeId(inst, 0);
      if (_.GetIdOpcode(named_barrier_type) != spv::Op::OpTypeNamedBarrier) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << spvOpcodeString(opcode)
               << ": expected Named Barrier to be of type OpTypeNamedBarrier";
      }

      const uint32_t memory_scope = inst->word(2);

      if (auto error = ValidateMemoryScope(_, inst, memory_scope)) {
        return error;
      }

      if (auto error = ValidateMemorySemantics(_, inst, 2, memory_scope)) {
        return error;
      }
      break;
    }

    default:
      break;
  }

  return SPV_SUCCESS;
}